

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O2

int sasl_mechanism_in_list(amqp_bytes_t mechanisms,amqp_sasl_method_enum method)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  void *__s;
  amqp_bytes_t aVar4;
  
  __s = mechanisms.bytes;
  aVar4 = sasl_method_name(method);
  pvVar3 = (void *)(mechanisms.len + (long)__s);
  pvVar2 = __s;
  while( true ) {
    if (pvVar2 == pvVar3) {
      return 0;
    }
    pvVar2 = memchr(__s,0x20,(long)pvVar3 - (long)__s);
    if (pvVar2 == (void *)0x0) {
      pvVar2 = pvVar3;
    }
    if (((__s != (void *)0x0 && aVar4.bytes != (void *)0x0) && aVar4.len == (long)pvVar2 - (long)__s
        ) && (iVar1 = bcmp(aVar4.bytes,__s,aVar4.len), iVar1 == 0)) break;
    __s = (void *)((long)pvVar2 + 1);
  }
  return 1;
}

Assistant:

int sasl_mechanism_in_list(amqp_bytes_t mechanisms,
                           amqp_sasl_method_enum method) {
  amqp_bytes_t mechanism;
  amqp_bytes_t supported_mechanism;
  uint8_t *start;
  uint8_t *end;
  uint8_t *current;

  assert(NULL != mechanisms.bytes);

  mechanism = sasl_method_name(method);

  start = (uint8_t *)mechanisms.bytes;
  current = start;
  end = start + mechanisms.len;

  for (; current != end; start = current + 1) {
    /* HACK: SASL states that we should be parsing this string as a UTF-8
     * string, which we're plainly not doing here. At this point its not worth
     * dragging an entire UTF-8 parser for this one case, and this should work
     * most of the time */
    current = memchr(start, ' ', end - start);
    if (NULL == current) {
      current = end;
    }
    supported_mechanism.bytes = start;
    supported_mechanism.len = current - start;
    if (bytes_equal(mechanism, supported_mechanism)) {
      return 1;
    }
  }

  return 0;
}